

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Int.cpp
# Opt level: O0

uint64_t SignExtend(uint64_t value,uint32_t bits)

{
  byte bVar1;
  undefined8 local_38;
  uint64_t sign;
  int64_t wide;
  uint64_t m1;
  uint32_t left;
  uint32_t bits_local;
  uint64_t value_local;
  
  bVar1 = 0x40 - (char)bits;
  if ((long)(value << (bVar1 & 0x3f)) < 0) {
    local_38 = -1L << (bVar1 & 0x3f);
  }
  else {
    local_38 = 0;
  }
  return value | local_38;
}

Assistant:

uint64_t SignExtend (uint64_t value, uint32_t bits)
{
    // Extract lower bits from value and signextend.
    // From detour_sign_extend.
    const uint32_t left = 64 - bits;
    const uint64_t m1 = (uint64_t)(int64_t)-1;
    const int64_t wide = (int64_t)(value << left);
    const uint64_t sign = (wide < 0) ? (m1 << left) : 0;
    return value | sign;
}